

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

bool __thiscall
ddd::DaTrie<false,_false,_false>::search_key(DaTrie<false,_false,_false> *this,Query *query)

{
  pointer pBVar1;
  pointer pcVar2;
  Bc BVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar7;
  char cVar8;
  uint32_t uVar9;
  ulong uVar6;
  
  pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  BVar3 = pBVar1[query->node_pos_];
  uVar5 = BVar3._0_4_;
  if ((int)uVar5 < 0) {
    if ((query->is_finished_ & 1U) != 0) goto LAB_00114d2d;
  }
  else {
    uVar4 = (ulong)query->node_pos_;
    uVar9 = query->pos_;
    do {
      uVar5 = (uint)(byte)query->key_[uVar9] ^ BVar3._0_4_;
      uVar6 = (ulong)uVar5;
      if ((*(uint *)&pBVar1[uVar6].field_0x4 & 0x7fffffff) != (uint)uVar4) {
        return false;
      }
      query->node_pos_ = uVar5;
      query->pos_ = uVar9 + 1;
      cVar8 = query->key_[uVar9];
      query->is_finished_ = cVar8 == '\0';
      BVar3 = pBVar1[uVar6];
      uVar5 = BVar3._0_4_;
      uVar4 = uVar6;
      uVar9 = uVar9 + 1;
    } while (-1 < (int)uVar5);
    if (cVar8 == '\0') {
LAB_00114d2d:
      uVar5 = uVar5 & 0x7fffffff;
      goto LAB_00114d48;
    }
  }
  uVar5 = uVar5 & 0x7fffffff;
  pcVar2 = (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  cVar8 = query->key_[query->pos_];
  if (cVar8 == '\0') {
    uVar4 = 1;
    uVar6 = 0;
  }
  else {
    uVar7 = 0;
    uVar4 = 1;
    do {
      uVar6 = uVar4;
      if (cVar8 != pcVar2[uVar7 + uVar5]) {
        return false;
      }
      cVar8 = query->key_[uVar6 + query->pos_];
      uVar4 = (ulong)((int)uVar6 + 1);
      uVar7 = uVar6;
    } while (cVar8 != '\0');
  }
  if (pcVar2[uVar6 + uVar5] != '\0') {
    return false;
  }
  uVar5 = *(uint *)(pcVar2 + uVar4 + uVar5);
LAB_00114d48:
  query->value_ = uVar5;
  return true;
}

Assistant:

bool search_key(Query& query) const {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());
    assert(!Prefix);

    while (!bc_[query.node_pos()].is_leaf()) {
      auto child_pos = bc_[query.node_pos()].base() ^query.label();
      if (bc_[child_pos].check() != query.node_pos()) {
        return false;
      }
      query.next(child_pos);
    }

    auto value = bc_[query.node_pos()].value();
    if (query.is_finished()) {
      query.set_value(value);
      return true;
    }

    uint32_t len = 0;
    auto tail = tail_.data() + value;
    if (!utils::match(query.key(), tail, len)) {
      return false;
    }
    query.set_value(utils::extract_value(tail + len));
    return true;
  }